

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O3

void __thiscall el::base::Storage::Storage(Storage *this,LogBuilderPtr *defaultLogBuilder)

{
  EnumType *pEVar1;
  _Rb_tree_header *p_Var2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  RegisteredHitCounters *pRVar4;
  RegisteredLoggers *pRVar5;
  VRegistry *pVVar6;
  Logger *this_01;
  string local_68;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
  *local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  (this->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00128cc8;
  pRVar4 = (RegisteredHitCounters *)operator_new(0x28);
  (pRVar4->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)0x0;
  *(undefined8 *)
   &(pRVar4->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
    super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
    .super_ThreadSafe.field_0x8 = 0;
  (pRVar4->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pRVar4->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pRVar4->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .m_list.super__Vector_base<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pRVar4->super_RegistryWithPred<el::base::HitCounter,_el::base::HitCounter::Predicate>).
  super_AbstractRegistry<el::base::HitCounter,_std::vector<el::base::HitCounter_*,_std::allocator<el::base::HitCounter_*>_>_>
  .super_ThreadSafe._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00128d48;
  this->m_registeredHitCounters = pRVar4;
  pRVar5 = (RegisteredLoggers *)operator_new(0xd0);
  RegisteredLoggers::RegisteredLoggers(pRVar5,defaultLogBuilder);
  this->m_registeredLoggers = pRVar5;
  pEVar1 = &this->m_flags;
  this->m_flags = 0;
  pVVar6 = (VRegistry *)operator_new(0x48);
  (pVVar6->super_ThreadSafe)._vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_00129478;
  *(undefined4 *)&(pVVar6->super_ThreadSafe).field_0xc = 0;
  pVVar6->m_pFlags = pEVar1;
  p_Var2 = &(pVVar6->m_modules)._M_t._M_impl.super__Rb_tree_header;
  (pVVar6->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pVVar6->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pVVar6->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  (pVVar6->m_modules)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (pVVar6->m_modules)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->m_vRegistry = pVVar6;
  (this->m_commandLineArgs)._vptr_CommandLineArgs = (_func_int **)&PTR__CommandLineArgs_001294e8;
  this_00 = &(this->m_commandLineArgs).m_paramsWithValue;
  p_Var2 = &(this->m_commandLineArgs).m_paramsWithValue._M_t._M_impl.super__Rb_tree_header;
  (this->m_commandLineArgs).m_paramsWithValue._M_t._M_impl.super__Rb_tree_header._M_header._M_color
       = _S_red;
  (this->m_commandLineArgs).m_paramsWithValue._M_t._M_impl.super__Rb_tree_header._M_header._M_parent
       = (_Base_ptr)0x0;
  (this->m_commandLineArgs).m_paramsWithValue._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_commandLineArgs).m_paramsWithValue._M_t._M_impl.super__Rb_tree_header._M_header._M_right
       = &p_Var2->_M_header;
  local_40 = &(this->m_commandLineArgs).m_params;
  (this->m_commandLineArgs).m_params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_commandLineArgs).m_params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_commandLineArgs).m_paramsWithValue._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_commandLineArgs).m_params.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(local_40);
  local_38 = this_00;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::clear(&this_00->_M_t);
  *(undefined8 *)((long)&(this->m_preRollOutCallback).super__Function_base._M_functor + 8) = 0;
  *(code **)&(this->m_preRollOutCallback).super__Function_base._M_functor =
       defaultPreRollOutCallback;
  (this->m_preRollOutCallback)._M_invoker =
       std::
       _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
       ::_M_invoke;
  (this->m_preRollOutCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_char_*,_unsigned_long),_void_(*)(const_char_*,_unsigned_long)>
       ::_M_manager;
  local_48 = &this->m_logDispatchCallbacks;
  p_Var2 = &(this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_logDispatchCallbacks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var2 = &(this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
       _S_red;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var2->_M_header;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var2->_M_header;
  (this->m_performanceTrackingCallbacks)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->m_customFormatSpecifiers).
  super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_customFormatSpecifiers).
  super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_customFormatSpecifiers).
  super__Vector_base<el::CustomFormatSpecifier,_std::allocator<el::CustomFormatSpecifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar5 = this->m_registeredLoggers;
  paVar3 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"default","");
  RegisteredLoggers::get(pRVar5,&local_68,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  pRVar5 = this->m_registeredLoggers;
  local_68._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"performance","");
  this_01 = RegisteredLoggers::get(pRVar5,&local_68,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"%datetime %level %msg","");
  Configurations::setGlobally(&this_01->m_configurations,Format,&local_68,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  Logger::configure(this_01,&this_01->m_configurations);
  *(byte *)pEVar1 = (byte)*pEVar1 | 2;
  local_68._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"DefaultLogDispatchCallback","");
  installCallback<el::base::DefaultLogDispatchCallback,std::shared_ptr<el::LogDispatchCallback>>
            (this,&local_68,local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"DefaultPerformanceTrackingCallback","");
  installCallback<el::base::DefaultPerformanceTrackingCallback,std::shared_ptr<el::PerformanceTrackingCallback>>
            (this,&local_68,&this->m_performanceTrackingCallbacks);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar3) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit Storage(const LogBuilderPtr& defaultLogBuilder) :
#endif  // ELPP_ASYNC_LOGGING
        m_registeredHitCounters(new base::RegisteredHitCounters()),
        m_registeredLoggers(new base::RegisteredLoggers(defaultLogBuilder)),
        m_flags(0x0),
        m_vRegistry(new base::VRegistry(0, &m_flags)),
#if ELPP_ASYNC_LOGGING
        m_asyncLogQueue(new base::AsyncLogQueue()),
        m_asyncDispatchWorker(asyncDispatchWorker),
#endif  // ELPP_ASYNC_LOGGING
        m_preRollOutCallback(base::defaultPreRollOutCallback) {
        // Register default logger
        m_registeredLoggers->get(std::string(base::consts::kDefaultLoggerId));
        // Register performance logger and reconfigure format
        Logger* performanceLogger = m_registeredLoggers->get(std::string(base::consts::kPerformanceLoggerId));
        performanceLogger->configurations()->setGlobally(ConfigurationType::Format, std::string("%datetime %level %msg"));
        performanceLogger->reconfigure();
#if defined(ELPP_SYSLOG)
        // Register syslog logger and reconfigure format
        Logger* sysLogLogger = m_registeredLoggers->get(std::string(base::consts::kSysLogLoggerId));
        sysLogLogger->configurations()->setGlobally(ConfigurationType::Format, std::string("%level: %msg"));
        sysLogLogger->reconfigure();
#else
        ELPP_UNUSED(base::consts::kSysLogLoggerId);
#endif //  defined(ELPP_SYSLOG)
        addFlag(LoggingFlag::AllowVerboseIfModuleNotSpecified);
#if ELPP_ASYNC_LOGGING
        installLogDispatchCallback<base::AsyncLogDispatchCallback>(std::string("AsyncLogDispatchCallback"));
#else
        installLogDispatchCallback<base::DefaultLogDispatchCallback>(std::string("DefaultLogDispatchCallback"));
#endif  // ELPP_ASYNC_LOGGING
            installPerformanceTrackingCallback<base::DefaultPerformanceTrackingCallback>(std::string("DefaultPerformanceTrackingCallback"));
            ELPP_INTERNAL_INFO(1, "Easylogging++ has been initialized");
#if ELPP_ASYNC_LOGGING
        m_asyncDispatchWorker->start();
#endif  // ELPP_ASYNC_LOGGING
    }